

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
::
transit_state<afsm::test::connection_fsm_def::closed,afsm::test::connection_fsm_def::terminated,afsm::test::events::terminate,afsm::actions::detail::guard_check<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::closed,afsm::test::events::terminate,afsm::none>,afsm::actions::detail::action_invocation<afsm::test::transit_action,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::closed,afsm::test::connection_fsm_def::terminated>,afsm::transitions::detail::state_exit<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::closed,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate>,afsm::transitions::detail::state_enter<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate>,afsm::transitions::detail::state_clear<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::state<afsm::test::connection_fsm_def::closed,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
          (state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
           *this,__tuple_element_t<0UL,_tuple<state<closed,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<connecting,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<authorizing,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<idle,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<terminated,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                 *event)

{
  event_process_result eVar1;
  undefined1 local_36 [6];
  __tuple_element_t<5UL,_tuple<state<closed,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<connecting,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<authorizing,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<idle,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<terminated,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
  *local_30;
  __tuple_element_t<5UL,_tuple<state<closed,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<connecting,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<authorizing,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<idle,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<terminated,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
  *target;
  __tuple_element_t<0UL,_tuple<state<closed,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<connecting,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<authorizing,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<idle,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<terminated,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
  *source;
  terminate *event_local;
  state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
  *this_local;
  
  source = event;
  event_local = (terminate *)this;
  target = (__tuple_element_t<5UL,_tuple<state<closed,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<connecting,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<authorizing,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<idle,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>,_state<terminated,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
            *)std::
              get<0ul,afsm::state<afsm::test::connection_fsm_def::closed,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::connecting,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::authorizing,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>
                        ((tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                          *)(this + 0x10));
  local_30 = std::
             get<5ul,afsm::state<afsm::test::connection_fsm_def::closed,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::connecting,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::authorizing,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>
                       ((tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                         *)(this + 0x10));
  eVar1 = transit_state_impl<afsm::state<afsm::test::connection_fsm_def::closed,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::terminate,afsm::actions::detail::guard_check<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::closed,afsm::test::events::terminate,afsm::none>,afsm::actions::detail::action_invocation<afsm::test::transit_action,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::closed,afsm::test::connection_fsm_def::terminated>,afsm::transitions::detail::state_exit<afsm::state_machine<afsm::test::connection___test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
                    (this,source,target,local_30,5,local_36);
  return eVar1;
}

Assistant:

actions::event_process_result
    transit_state(Event&& event, Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear)
    {
        using source_index = ::psst::meta::index_of<SourceState, inner_states_def>;
        using target_index = ::psst::meta::index_of<TargetState, inner_states_def>;

        static_assert(source_index::found, "Failed to find source state index");
        static_assert(target_index::found, "Failed to find target state index");

        auto& source = ::std::get< source_index::value >(states_);
        auto& target = ::std::get< target_index::value >(states_);
        return transit_state_impl(
                ::std::forward<Event>(event), source, target,
                 guard, action, exit, enter, clear,
                 target_index::value,
                 typename def::traits::exception_safety<state_machine_definition_type>::type{});
    }